

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ReleaseLastInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  Rep *pRVar2;
  Type *pTVar3;
  int iVar4;
  LogMessage *pLVar5;
  LogFinisher local_49;
  LogMessage local_48;
  
  if (this->arena_ != (Arena *)0x0) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x498);
    pLVar5 = LogMessage::operator<<(&local_48,"CHECK failed: GetArena() == nullptr: ");
    pLVar5 = LogMessage::operator<<
                       (pLVar5,"ReleaseLast() called on a RepeatedPtrField that is on an arena, ");
    pLVar5 = LogMessage::operator<<
                       (pLVar5,"with a type that does not implement MergeFrom. This is unsafe; ");
    pLVar5 = LogMessage::operator<<(pLVar5,"please implement MergeFrom for your type.");
    LogFinisher::operator=(&local_49,pLVar5);
    LogMessage::~LogMessage(&local_48);
  }
  iVar4 = this->current_size_;
  if (iVar4 < 1) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x4a2);
    pLVar5 = LogMessage::operator<<(&local_48,"CHECK failed: (current_size_) > (0): ");
    LogFinisher::operator=(&local_49,pLVar5);
    LogMessage::~LogMessage(&local_48);
    iVar4 = this->current_size_;
  }
  pRVar2 = this->rep_;
  this->current_size_ = iVar4 + -1;
  pTVar3 = (Type *)pRVar2->elements[(long)iVar4 + -1];
  iVar1 = pRVar2->allocated_size;
  pRVar2->allocated_size = iVar1 + -1;
  if (iVar4 < iVar1) {
    pRVar2->elements[(long)iVar4 + -1] = pRVar2->elements[(long)iVar1 + -1];
  }
  return pTVar3;
}

Assistant:

inline typename TypeHandler::Type* RepeatedPtrFieldBase::ReleaseLastInternal(
    std::false_type) {
  GOOGLE_DCHECK(GetArena() == nullptr)
      << "ReleaseLast() called on a RepeatedPtrField that is on an arena, "
      << "with a type that does not implement MergeFrom. This is unsafe; "
      << "please implement MergeFrom for your type.";
  return UnsafeArenaReleaseLast<TypeHandler>();
}